

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O1

void CLI::AsNumberWithUnit::validate_mapping<double>
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                *mapping,Options opts)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *p_Var3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  _Base_ptr p_Var5;
  const_iterator cVar6;
  mapped_type_conflict1 *pmVar7;
  ValidationError *pVVar8;
  char *pcVar9;
  string s;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  lower_mapping;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_150;
  size_type local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  key_type local_110;
  key_type local_f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  local_d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *local_a0;
  mapped_type_conflict1 local_98;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  p_Var5 = (mapping->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(mapping->_M_t)._M_impl.super__Rb_tree_header;
  while( true ) {
    if ((_Rb_tree_header *)p_Var5 == p_Var1) {
      if ((opts & CASE_INSENSITIVE) != CASE_SENSITIVE) {
        local_d0._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_d0._M_impl.super__Rb_tree_header._M_header;
        local_d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_d0._M_impl.super__Rb_tree_header._M_node_count = 0;
        p_Var5 = (mapping->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        local_d0._M_impl.super__Rb_tree_header._M_header._M_right =
             local_d0._M_impl.super__Rb_tree_header._M_header._M_left;
        local_a0 = &mapping->_M_t;
        if ((_Rb_tree_header *)p_Var5 != p_Var1) {
          paVar2 = &local_110.field_2;
          do {
            local_130 = &local_120;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_130,*(long *)(p_Var5 + 1),
                       (long)&(p_Var5[1]._M_parent)->_M_color + *(long *)(p_Var5 + 1));
            ::std::
            transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
                      (local_130,local_130->_M_local_buf + local_128,local_130);
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            if (local_130 == &local_120) {
              local_f0.field_2._8_8_ = local_120._8_8_;
            }
            else {
              local_f0._M_dataplus._M_p = (pointer)local_130;
            }
            local_f0.field_2._M_allocated_capacity._1_7_ = local_120._M_allocated_capacity._1_7_;
            local_f0.field_2._M_local_buf[0] = local_120._M_local_buf[0];
            local_f0._M_string_length = local_128;
            local_128 = 0;
            local_120._M_local_buf[0] = '\0';
            local_130 = &local_120;
            cVar6 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                    ::find(&local_d0,&local_f0);
            if ((_Rb_tree_header *)cVar6._M_node != &local_d0._M_impl.super__Rb_tree_header) {
              pVVar8 = (ValidationError *)__cxa_allocate_exception(0x38);
              local_110._M_dataplus._M_p = (pointer)paVar2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_110,
                         "Several matching lowercase unit representations are found: ","");
              ::std::operator+(&local_50,&local_110,&local_f0);
              ValidationError::ValidationError(pVVar8,&local_50);
              __cxa_throw(pVVar8,&ValidationError::typeinfo,Error::~Error);
            }
            local_98 = *(mapped_type_conflict1 *)(p_Var5 + 2);
            local_150 = &local_140;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_150,*(long *)(p_Var5 + 1),
                       (long)&(p_Var5[1]._M_parent)->_M_color + *(long *)(p_Var5 + 1));
            ::std::
            transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
                      (local_150,local_150->_M_local_buf + local_148,local_150);
            if (local_150 == &local_140) {
              local_110.field_2._8_8_ = local_140._8_8_;
              local_110._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_110._M_dataplus._M_p = (pointer)local_150;
            }
            local_110.field_2._M_allocated_capacity._1_7_ = local_140._M_allocated_capacity._1_7_;
            local_110.field_2._M_local_buf[0] = local_140._M_local_buf[0];
            local_110._M_string_length = local_148;
            local_148 = 0;
            local_140._M_local_buf[0] = '\0';
            local_150 = &local_140;
            pmVar7 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                   *)&local_d0,&local_110);
            *pmVar7 = local_98;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != paVar2) {
              operator_delete(local_110._M_dataplus._M_p);
            }
            if (local_150 != &local_140) {
              operator_delete(local_150);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p);
            }
            p_Var5 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5);
          } while ((_Rb_tree_header *)p_Var5 != p_Var1);
        }
        p_Var3 = local_a0;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
        ::clear(local_a0);
        if (local_d0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          (p_Var3->_M_impl).super__Rb_tree_header._M_header._M_color =
               local_d0._M_impl.super__Rb_tree_header._M_header._M_color;
          (p_Var3->_M_impl).super__Rb_tree_header._M_header._M_parent =
               local_d0._M_impl.super__Rb_tree_header._M_header._M_parent;
          (p_Var3->_M_impl).super__Rb_tree_header._M_header._M_left =
               local_d0._M_impl.super__Rb_tree_header._M_header._M_left;
          (p_Var3->_M_impl).super__Rb_tree_header._M_header._M_right =
               local_d0._M_impl.super__Rb_tree_header._M_header._M_right;
          (local_d0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
               &p_Var1->_M_header;
          (p_Var3->_M_impl).super__Rb_tree_header._M_node_count =
               local_d0._M_impl.super__Rb_tree_header._M_node_count;
          local_d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_d0._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_d0._M_impl.super__Rb_tree_header._M_header;
          local_d0._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_d0._M_impl.super__Rb_tree_header._M_header._M_right =
               local_d0._M_impl.super__Rb_tree_header._M_header._M_left;
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
        ::~_Rb_tree(&local_d0);
      }
      return;
    }
    if (p_Var5[1]._M_parent == (_Base_ptr)0x0) {
      pVVar8 = (ValidationError *)__cxa_allocate_exception(0x38);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"Unit must not be empty.","");
      ValidationError::ValidationError(pVVar8,&local_70);
      __cxa_throw(pVVar8,&ValidationError::typeinfo,Error::~Error);
    }
    pcVar9 = (char *)((long)&(p_Var5[1]._M_parent)->_M_color + *(long *)(p_Var5 + 1));
    _Var4 = ::std::
            __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_negate<CLI::detail::isalpha(std::__cxx11::string_const&)::_lambda(char)_1_>>
                      (*(long *)(p_Var5 + 1),pcVar9);
    if (_Var4._M_current != pcVar9) break;
    p_Var5 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5);
  }
  pVVar8 = (ValidationError *)__cxa_allocate_exception(0x38);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"Unit must contain only letters.","");
  ValidationError::ValidationError(pVVar8,&local_90);
  __cxa_throw(pVVar8,&ValidationError::typeinfo,Error::~Error);
}

Assistant:

static void validate_mapping(std::map<std::string, Number> &mapping, Options opts) {
        for(auto &kv : mapping) {
            if(kv.first.empty()) {
                throw ValidationError("Unit must not be empty.");
            }
            if(!detail::isalpha(kv.first)) {
                throw ValidationError("Unit must contain only letters.");
            }
        }

        // make all units lowercase if CASE_INSENSITIVE
        if(opts & CASE_INSENSITIVE) {
            std::map<std::string, Number> lower_mapping;
            for(auto &kv : mapping) {
                auto s = detail::to_lower(kv.first);
                if(lower_mapping.count(s)) {
                    throw ValidationError(std::string("Several matching lowercase unit representations are found: ") +
                                          s);
                }
                lower_mapping[detail::to_lower(kv.first)] = kv.second;
            }
            mapping = std::move(lower_mapping);
        }
    }